

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void __thiscall http_header::http_header(http_header *this,char *str,size_t len)

{
  char *pcVar1;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  
  in_RDI[1] = in_RDX + 2;
  pcVar1 = lib_alloc_str((size_t)in_RDI);
  *in_RDI = (long)pcVar1;
  memcpy((void *)*in_RDI,in_RSI,in_RDX);
  *(undefined1 *)(*in_RDI + in_RDX) = 0xd;
  *(undefined1 *)(*in_RDI + 1 + in_RDX) = 10;
  in_RDI[2] = 0;
  return;
}

Assistant:

http_header(const char *str, size_t len)
    {
        /* allocate the string, with two extra bytes for the CR-LF */
        this->len = len + 2;
        this->str = lib_alloc_str(this->len);

        /* copy the string */
        memcpy(this->str, str, len);

        /* add the CR-LF */
        this->str[len] = '\r';
        this->str[len+1] = '\n';

        /* we're not in a list yet */
        nxt = 0;
    }